

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cc
# Opt level: O2

btree_result
btree_init(btree *btree,void *blk_handle,btree_blk_ops *blk_ops,btree_kv_ops *kv_ops,
          uint32_t nodesize,uint8_t ksize,uint8_t vsize,bnode_flag_t flag,btree_meta *meta)

{
  btree_result bVar1;
  voidref addr;
  size_t sVar2;
  ulong uVar3;
  
  btree->root_flag = flag | 1;
  btree->blk_ops = blk_ops;
  btree->blk_handle = blk_handle;
  btree->kv_ops = kv_ops;
  btree->height = 1;
  btree->blksize = nodesize;
  btree->ksize = ksize;
  btree->vsize = vsize;
  if (meta == (btree_meta *)0x0) {
    uVar3 = 0x11;
  }
  else {
    btree->root_flag = flag | 3;
    uVar3 = (ulong)(meta->size + 0x11 & 0xfffffff0) + 0x11;
  }
  if (nodesize < (uint)uVar3) {
    bVar1 = BTREE_RESULT_FAIL;
  }
  else {
    if ((blk_ops->blk_alloc_sub == (_func_voidref_void_ptr_bid_t_ptr *)0x0) ||
       (blk_ops->blk_enlarge_node == (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)0x0)) {
      addr = (*blk_ops->blk_alloc)(blk_handle,&btree->root_bid);
    }
    else {
      addr = (*blk_ops->blk_alloc_sub)(blk_handle,&btree->root_bid);
      if ((meta != (btree_meta *)0x0) &&
         (sVar2 = (*btree->blk_ops->blk_get_size)(btree->blk_handle,btree->root_bid), sVar2 < uVar3)
         ) {
        addr = (*btree->blk_ops->blk_enlarge_node)
                         (btree->blk_handle,btree->root_bid,uVar3,&btree->root_bid);
      }
    }
    _btree_init_node(btree,btree->root_bid,addr,btree->root_flag,1,meta);
    bVar1 = BTREE_RESULT_SUCCESS;
  }
  return bVar1;
}

Assistant:

btree_result btree_init(
        struct btree *btree, void *blk_handle,
        struct btree_blk_ops *blk_ops,     struct btree_kv_ops *kv_ops,
        uint32_t nodesize, uint8_t ksize, uint8_t vsize,
        bnode_flag_t flag, struct btree_meta *meta)
{
    void *addr;
    size_t min_nodesize = 0;

    btree->root_flag = BNODE_MASK_ROOT | flag;
    btree->blk_ops = blk_ops;
    btree->blk_handle = blk_handle;
    btree->kv_ops = kv_ops;
    btree->height = 1;
    btree->blksize = nodesize;
    btree->ksize = ksize;
    btree->vsize = vsize;
    if (meta) {
        btree->root_flag |= BNODE_MASK_METADATA;
        min_nodesize = sizeof(struct bnode) + _metasize_align(meta->size) +
                       sizeof(metasize_t) + BLK_MARKER_SIZE;
    } else {
        min_nodesize = sizeof(struct bnode) + BLK_MARKER_SIZE;
    }

    if (min_nodesize > btree->blksize) {
        // too large metadata .. init fail
        return BTREE_RESULT_FAIL;
    }

    // create the first root node
    if (btree->blk_ops->blk_alloc_sub && btree->blk_ops->blk_enlarge_node) {
        addr = btree->blk_ops->blk_alloc_sub(btree->blk_handle, &btree->root_bid);
        if (meta) {
            // check if the initial node size including metadata is
            // larger than the subblock size
            size_t subblock_size;
            subblock_size = btree->blk_ops->blk_get_size(btree->blk_handle,
                                                         btree->root_bid);
            if (subblock_size < min_nodesize) {
                addr = btree->blk_ops->blk_enlarge_node(btree->blk_handle,
                                                        btree->root_bid,
                                                        min_nodesize,
                                                        &btree->root_bid);
            }
        }
    } else {
        addr = btree->blk_ops->blk_alloc (btree->blk_handle, &btree->root_bid);
    }
    _btree_init_node(btree, btree->root_bid, addr,
                     btree->root_flag, BNODE_MASK_ROOT, meta);

    return BTREE_RESULT_SUCCESS;
}